

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::schema::Brand::Binding::Builder::initType(Builder *__return_storage_ptr__,Builder *this)

{
  uint uVar1;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::schema::Brand::Binding::Which>
            (&this->_builder,uVar1,TYPE);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  capnp::_::PointerHelpers<capnp::schema::Type,_(capnp::Kind)3>::init
            ((EVP_PKEY_CTX *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::schema::Type::Builder Brand::Binding::Builder::initType() {
  _builder.setDataField<Brand::Binding::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Brand::Binding::TYPE);
  return ::capnp::_::PointerHelpers< ::capnp::schema::Type>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS));
}